

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

bool __thiscall duckdb::Binder::CTEIsAlreadyBound(Binder *this,CommonTableExpressionInfo *cte)

{
  bool bVar1;
  iterator iVar2;
  Binder *this_00;
  key_type local_18;
  
  local_18._M_data = cte;
  iVar2 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,_duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->bound_ctes)._M_h,&local_18);
  bVar1 = true;
  if (iVar2.
      super__Node_iterator_base<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_true>.
      _M_cur == (__node_type *)0x0) {
    bVar1 = false;
    if (((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) && (bVar1 = false, this->binder_type == REGULAR_BINDER)) {
      this_00 = shared_ptr<duckdb::Binder,_true>::operator->(&this->parent);
      bVar1 = CTEIsAlreadyBound(this_00,cte);
    }
  }
  return bVar1;
}

Assistant:

bool Binder::CTEIsAlreadyBound(CommonTableExpressionInfo &cte) {
	if (bound_ctes.find(cte) != bound_ctes.end()) {
		return true;
	}
	if (parent && binder_type == BinderType::REGULAR_BINDER) {
		return parent->CTEIsAlreadyBound(cte);
	}
	return false;
}